

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cpp
# Opt level: O1

bool spvtools::opt::ExtInsConflict
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *extIndices,Instruction *insInst
               ,uint32_t extOffset)

{
  uint32_t uVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  
  lVar7 = (long)(extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start >> 2;
  uVar3 = (insInst->has_result_id_ & 1) + 1;
  if (insInst->has_type_id_ == false) {
    uVar3 = (uint)insInst->has_result_id_;
  }
  uVar3 = ((int)((ulong)((long)(insInst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(insInst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar3
          ) - 2;
  if (lVar7 - (ulong)extOffset == (ulong)uVar3) {
    bVar8 = false;
  }
  else {
    uVar6 = (int)lVar7 - extOffset;
    if (uVar3 < uVar6) {
      uVar6 = uVar3;
    }
    bVar8 = uVar6 == 0;
    if (!bVar8) {
      uVar1 = (extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[extOffset];
      uVar3 = (insInst->has_result_id_ & 1) + 1;
      if (insInst->has_type_id_ == false) {
        uVar3 = (uint)insInst->has_result_id_;
      }
      uVar4 = Instruction::GetSingleWordOperand(insInst,uVar3 + 2);
      if (uVar1 == uVar4) {
        uVar2 = 1;
        do {
          uVar5 = uVar2;
          if (uVar6 == uVar5) break;
          uVar1 = (extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start[extOffset + (int)uVar5];
          uVar3 = (insInst->has_result_id_ & 1) + 1;
          if (insInst->has_type_id_ == false) {
            uVar3 = (uint)insInst->has_result_id_;
          }
          uVar4 = Instruction::GetSingleWordOperand(insInst,uVar3 + (int)uVar5 + 2);
          uVar2 = uVar5 + 1;
        } while (uVar1 == uVar4);
        bVar8 = uVar6 <= uVar5;
      }
    }
  }
  return bVar8;
}

Assistant:

bool ExtInsConflict(const std::vector<uint32_t>& extIndices,
                    const Instruction* insInst, const uint32_t extOffset) {
  if (extIndices.size() - extOffset == insInst->NumInOperands() - 2)
    return false;
  uint32_t extNumIndices = static_cast<uint32_t>(extIndices.size()) - extOffset;
  uint32_t insNumIndices = insInst->NumInOperands() - 2;
  uint32_t numIndices = std::min(extNumIndices, insNumIndices);
  for (uint32_t i = 0; i < numIndices; ++i)
    if (extIndices[i + extOffset] != insInst->GetSingleWordInOperand(i + 2))
      return false;
  return true;
}